

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int moveToRightmost(BtCursor *pCur)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  MemPage *pPage;
  int rc;
  Pgno pgno;
  BtCursor *in_stack_ffffffffffffffd8;
  
  do {
    lVar1 = *(long *)(in_RDI + 0x88);
    if (*(char *)(lVar1 + 8) != '\0') {
      *(short *)(in_RDI + 0x56) = *(short *)(lVar1 + 0x18) + -1;
      return 0;
    }
    sqlite3Get4byte((u8 *)(*(long *)(lVar1 + 0x50) + (long)(int)(*(byte *)(lVar1 + 9) + 8)));
    *(undefined2 *)(in_RDI + 0x56) = *(undefined2 *)(lVar1 + 0x18);
    iVar2 = moveToChild(in_stack_ffffffffffffffd8,0);
  } while (iVar2 == 0);
  return iVar2;
}

Assistant:

static int moveToRightmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage = 0;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( !(pPage = pCur->pPage)->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    pCur->ix = pPage->nCell;
    rc = moveToChild(pCur, pgno);
    if( rc ) return rc;
  }
  pCur->ix = pPage->nCell-1;
  assert( pCur->info.nSize==0 );
  assert( (pCur->curFlags & BTCF_ValidNKey)==0 );
  return SQLITE_OK;
}